

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructShader<tinyusdz::UsdPrimvarReader<tinyusdz::value::normal3f>>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               UsdPrimvarReader_normal *preader,string *warn,string *err,
               PrimReconstructOptions *options)

{
  Property *prop;
  char *pcVar1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  undefined8 uVar4;
  string *psVar5;
  size_type sVar6;
  undefined8 uVar7;
  ulong uVar8;
  fmt fVar9;
  int iVar10;
  ostream *poVar11;
  undefined8 *puVar12;
  long *plVar13;
  const_iterator cVar14;
  long *plVar15;
  mapped_type *pmVar16;
  _Base_ptr p_Var17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  Property *args;
  undefined8 __n;
  size_type __n_00;
  size_t __n_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer pcVar20;
  char *pcVar21;
  _Alloc_hider _Var22;
  Property *prop_00;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *args_2;
  _Base_ptr __k;
  byte bVar23;
  bool bVar24;
  bool bVar25;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e_1;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> av;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9e8;
  undefined1 local_610 [16];
  undefined1 local_600 [24];
  undefined1 local_5e8 [8];
  _Alloc_hider local_5e0;
  undefined1 local_5d8 [8];
  undefined1 auStack_5d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b0;
  _Base_ptr local_5a0;
  UsdPrimvarReader_normal *local_598;
  string *local_590;
  key_type local_588;
  AttrMetas *local_568;
  AttrMetas *local_560;
  TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *local_558;
  _Base_ptr local_550;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  undefined4 *local_4f8;
  undefined8 local_4f0;
  undefined4 local_4e8;
  undefined2 uStack_4e4;
  undefined1 uStack_4e2;
  undefined1 uStack_4e1;
  string *local_4d8;
  optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *local_4d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_4c8;
  string *local_4c0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *local_4b8;
  _Base_ptr local_4b0;
  long *local_4a8;
  ulong local_4a0;
  long local_498 [2];
  undefined1 local_488 [8];
  undefined1 local_480 [16];
  undefined8 auStack_470 [11];
  ios_base local_418 [264];
  string local_310 [16];
  long local_300 [2];
  string local_2f0;
  undefined1 local_2d0 [32];
  undefined1 local_2b0 [12];
  storage_t<unsigned_int> sStack_2a4;
  undefined1 local_2a0 [16];
  undefined1 local_290 [32];
  undefined1 local_270 [24];
  undefined1 local_258 [24];
  ios_base aiStack_240 [16];
  ios_base aiStack_230 [8];
  bool local_228;
  storage_t<double> local_220;
  bool local_218;
  storage_t<tinyusdz::Token> local_210;
  undefined1 local_1f0 [48];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  undefined1 auStack_170 [40];
  undefined1 auStack_148 [16];
  undefined1 local_138 [40];
  undefined1 local_110 [40];
  undefined1 local_e8 [32];
  size_t local_c8;
  undefined1 auStack_c0 [40];
  undefined1 auStack_98 [24];
  undefined1 local_80 [80];
  
  local_548._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_548._M_impl.super__Rb_tree_header._M_header;
  local_548._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_548._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_548._M_impl.super__Rb_tree_header._M_node_count = 0;
  prop_00 = (Property *)warn;
  args_2 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)err;
  local_598 = preader;
  local_548._M_impl.super__Rb_tree_header._M_header._M_right =
       local_548._M_impl.super__Rb_tree_header._M_header._M_left;
  local_2b0._0_8_ = local_2a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"info:id","");
  ::std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_548,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
    operator_delete((void *)local_2b0._0_8_,
                    CONCAT26(local_2a0._6_2_,CONCAT42(local_2a0._2_4_,local_2a0._0_2_)) + 1);
  }
  p_Var17 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_4b0 = &(properties->_M_t)._M_impl.super__Rb_tree_header._M_header;
  bVar23 = p_Var17 == local_4b0;
  if (!(bool)bVar23) {
    local_568 = &(local_598->fallback)._metas;
    local_4b8 = &(local_598->fallback)._paths;
    local_4d0 = (optional<tinyusdz::Animatable<tinyusdz::value::normal3f>> *)
                &(local_598->fallback)._attrib;
    local_558 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)&local_598->varname;
    local_560 = &(local_598->result)._metas;
    local_4d8 = (string *)&(local_598->result)._actual_type_name;
    local_4c8 = &(local_598->super_ShaderNode).super_UsdShadePrim.props;
    local_590 = err;
    local_4c0 = warn;
    do {
      local_518._M_allocated_capacity = (size_type)&local_508;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_518,*(long *)(p_Var17 + 1),
                 (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
      local_5c0._M_allocated_capacity = (size_type)&local_5b0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)(auStack_5d0 + 0x10),"inputs:fallback","");
      uVar7 = local_518._8_8_;
      uVar4 = local_5c0._8_8_;
      local_5e0._M_p = auStack_5d0;
      local_5d8 = (undefined1  [8])0x0;
      auStack_5d0._0_8_ = auStack_5d0._0_8_ & 0xffffffffffffff00;
      __n = local_518._8_8_;
      if ((ulong)local_5c0._8_8_ < (ulong)local_518._8_8_) {
        __n = local_5c0._8_8_;
      }
      if (__n == 0) {
        bVar24 = true;
      }
      else {
        iVar10 = bcmp((void *)local_518._M_allocated_capacity,
                      (void *)local_5c0._M_allocated_capacity,__n);
        bVar24 = iVar10 == 0;
      }
      prop = (Property *)(p_Var17 + 2);
      if ((bool)(bVar24 ^ 1U | uVar7 != uVar4)) {
        local_5e8._0_4_ = 1;
      }
      else {
        pcVar21 = local_480 + 8;
        if (((ulong)p_Var17[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          local_5e8._0_4_ = 7;
          local_610._0_8_ = &DAT_0000003e;
          local_488 = (undefined1  [8])pcVar21;
          local_488 = (undefined1  [8])
                      ::std::__cxx11::string::_M_create((ulong *)local_488,(ulong)local_610);
          local_480._8_6_ = (undefined6)local_610._0_8_;
          local_480._14_2_ = SUB82(local_610._0_8_,6);
          builtin_strncpy((char *)local_488,
                          "Property `{}` must be Attribute, but declared as Relationship.",0x3e);
          *(char *)((long)local_488 + local_610._0_8_) = '\0';
          local_480._0_6_ = local_480._8_6_;
          local_480._6_2_ = local_480._14_2_;
          fmt::format<std::__cxx11::string>
                    ((string *)local_2b0,(fmt *)local_488,(string *)(auStack_5d0 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_610._0_8_);
          ::std::__cxx11::string::operator=((string *)&local_5e0,(string *)local_2b0);
          if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
            operator_delete((void *)local_2b0._0_8_,
                            CONCAT26(local_2a0._6_2_,CONCAT42(local_2a0._2_4_,local_2a0._0_2_)) + 1)
            ;
          }
          if (local_488 != (undefined1  [8])pcVar21) {
            operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
          }
        }
        if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
          std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_4b8,
                     (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                     &p_Var17[6]._M_parent);
          local_5e8 = (undefined1  [8])((ulong)local_5e8 & 0xffffffff00000000);
        }
        Attribute::type_name_abi_cxx11_((string *)local_610,(Attribute *)prop);
        local_2b0._0_8_ = local_2a0;
        local_2a0._0_2_ = 0x6f6e;
        local_2a0._2_4_ = 0x6c616d72;
        local_2a0._6_2_ = 0x6633;
        local_2b0._8_4_ = 8;
        sStack_2a4._0_2_ = 0;
        sStack_2a4._2_2_ = 0;
        local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
        if ((pointer)local_610._8_8_ == (pointer)0x8) {
          bVar24 = *(long *)local_610._0_8_ == 0x66336c616d726f6e;
        }
        else {
          bVar24 = false;
        }
        bVar25 = true;
        if (!bVar24) {
          local_4f8 = &local_4e8;
          uStack_4e4 = 0x3374;
          local_4e8 = 0x616f6c66;
          local_4f0 = 6;
          uStack_4e2 = 0;
          if ((pointer)local_610._8_8_ == (pointer)0x6) {
            bVar25 = (short)*(int *)(local_610._0_8_ + 4) == 0x3374 &&
                     *(int *)local_610._0_8_ == 0x616f6c66;
          }
          else {
            bVar25 = false;
          }
        }
        if ((!bVar24) && (local_4f8 != &local_4e8)) {
          operator_delete(local_4f8,
                          CONCAT17(uStack_4e1,CONCAT16(uStack_4e2,CONCAT24(uStack_4e4,local_4e8))) +
                          1);
        }
        if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
          operator_delete((void *)local_2b0._0_8_,
                          CONCAT26(local_2a0._6_2_,CONCAT42(local_2a0._2_4_,local_2a0._0_2_)) + 1);
        }
        if (bVar25) {
          iVar10 = *(int *)((long)&p_Var17[0x17]._M_parent + 4);
          if (iVar10 != 1) {
            if (iVar10 == 0) {
              (local_598->fallback)._value_empty = true;
              AttrMetas::operator=(local_568,(AttrMetas *)(p_Var17 + 7));
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(auStack_5d0 + 0x10);
LAB_0023e5d9:
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_548,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         paVar19);
              local_5e8 = (undefined1  [8])((ulong)local_5e8 & 0xffffffff00000000);
            }
            else {
              prop_00 = (Property *)0x25;
              ::std::__cxx11::string::_M_replace((ulong)&local_5e0,0,(char *)local_5d8,0x3bcc94);
              local_5e8._0_4_ = 8;
            }
            goto LAB_0023e5e6;
          }
          if (p_Var17[5]._M_left == p_Var17[5]._M_parent) {
            if (p_Var17[4]._M_right == (_Base_ptr)0x0) {
              bVar24 = false;
            }
            else {
              iVar10 = (**(code **)p_Var17[4]._M_right)();
              bVar24 = iVar10 == 4;
            }
            if ((bVar24) || ((p_Var17[5]._M_color & _S_black) != _S_red)) {
              (local_598->fallback)._blocked = true;
            }
          }
          if (((char)p_Var17[5]._M_color == _S_red) &&
             ((((p_Var17[4]._M_right != (_Base_ptr)0x0 &&
                (iVar10 = (**(code **)p_Var17[4]._M_right)(), iVar10 == 0)) ||
               ((p_Var17[4]._M_right != (_Base_ptr)0x0 &&
                (iVar10 = (**(code **)p_Var17[4]._M_right)(), iVar10 == 1)))) &&
              (p_Var17[5]._M_left == p_Var17[5]._M_parent)))) {
            bVar24 = true;
            bVar25 = false;
          }
          else {
            anon_unknown_0::ConvertToAnimatable<tinyusdz::value::normal3f>
                      ((optional<tinyusdz::Animatable<tinyusdz::value::normal3f>_> *)local_488,
                       (PrimVar *)&p_Var17[4]._M_parent);
            fVar9 = local_488[0];
            local_2b0[0] = local_488[0];
            if (local_488[0] == (fmt)0x1) {
              local_2a0._0_2_ = (undefined2)local_480._8_6_;
              local_2a0._2_4_ = SUB64(local_480._8_6_,2);
              local_2b0._8_4_ = (undefined4)local_480._0_6_;
              sStack_2a4._0_2_ = SUB62(local_480._0_6_,4);
              sStack_2a4._2_2_ = local_480._6_2_;
              local_2a0._8_8_ = auStack_470[0];
              local_290._0_8_ = auStack_470[1];
              local_290._8_8_ = auStack_470[2];
              auStack_470[0] = (void *)0x0;
              auStack_470[1] = 0;
              auStack_470[2] = 0;
              local_290[0x10] = (undefined1)auStack_470[3];
              nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::normal3f>>::
              operator=(local_4d0,(Animatable<tinyusdz::value::normal3f> *)(local_2b0 + 8));
            }
            else {
              local_5e8._0_4_ = 8;
              prop_00 = (Property *)0x55;
              ::std::__cxx11::string::_M_replace((ulong)&local_5e0,0,(char *)local_5d8,0x3bcf62);
            }
            if (((ostringstream)local_2b0[0] == (ostringstream)0x1) &&
               ((anon_struct_8_0_00000001_for___align)local_2a0._8_8_ !=
                (anon_struct_8_0_00000001_for___align)0x0)) {
              operator_delete((void *)local_2a0._8_8_,local_290._8_8_ - local_2a0._8_8_);
            }
            if (fVar9 != (fmt)0x0) {
              AttrMetas::operator=(local_568,(AttrMetas *)(p_Var17 + 7));
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_548,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (auStack_5d0 + 0x10));
              local_5e8 = (undefined1  [8])((ulong)local_5e8 & 0xffffffff00000000);
            }
            bVar25 = true;
            bVar24 = false;
          }
          if (bVar24) {
            if (p_Var17[6]._M_left != p_Var17[6]._M_parent) {
              AttrMetas::operator=(local_568,(AttrMetas *)(p_Var17 + 7));
              paVar19 = &local_518;
              goto LAB_0023e5d9;
            }
            goto LAB_0023e5e6;
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600) {
            operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
          }
          if ((bVar25) ||
             (pcVar20 = (pointer)auStack_5d0._0_8_, _Var22._M_p = local_5e0._M_p,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._M_p ==
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5d0))
          goto LAB_0023e602;
        }
        else {
          local_5e8._0_4_ = 3;
          ::std::__cxx11::stringstream::stringstream((stringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2a0,"Property type mismatch. ",0x18);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2a0,(char *)local_5c0._M_allocated_capacity,
                               local_5c0._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," expects type `",0xf);
          local_480._8_6_ = 0x6c616d726f6e;
          local_480._14_2_ = 0x6633;
          local_480._0_6_ = 8;
          local_480._6_2_ = 0;
          auStack_470[0] = auStack_470[0] & 0xffffffffffffff00;
          local_488 = (undefined1  [8])pcVar21;
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar21,8);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"` but defined as type `",0x17);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(char *)local_610._0_8_,local_610._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"`",1);
          if (local_488 != (undefined1  [8])pcVar21) {
            operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
          }
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)&local_5e0,(string *)local_488);
          if (local_488 != (undefined1  [8])pcVar21) {
            operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
          }
          ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_230);
LAB_0023e5e6:
          pcVar20 = (pointer)local_600._0_8_;
          _Var22._M_p = (pointer)local_610._0_8_;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610._0_8_
              == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600)
          goto LAB_0023e602;
        }
        operator_delete(_Var22._M_p,(ulong)(pcVar20 + 1));
      }
LAB_0023e602:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_allocated_capacity != &local_5b0) {
        operator_delete((void *)local_5c0._M_allocated_capacity,local_5b0._M_allocated_capacity + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._M_allocated_capacity != &local_508) {
        operator_delete((void *)local_518._M_allocated_capacity,local_508._M_allocated_capacity + 1)
        ;
      }
      iVar10 = 0;
      if (((ulong)local_5e8 & 0xfffffffd) == 0) {
        iVar10 = 3;
LAB_0023e89b:
        bVar24 = false;
      }
      else {
        bVar24 = true;
        if (local_5e8._0_4_ != 1) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2b0,"ReconstructShader",0x11);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
          poVar11 = (ostream *)::std::ostream::operator<<((string *)local_2b0,0x119a);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          local_610._0_8_ = local_600;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_610,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[16],std::__cxx11::string>
                    ((string *)local_488,(fmt *)local_610,(string *)"inputs:fallback",
                     (char (*) [16])&local_5e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00);
          poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2b0,(char *)local_488,
                               CONCAT26(local_480._6_2_,local_480._0_6_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
          pcVar21 = local_480 + 8;
          if (local_488 != (undefined1  [8])pcVar21) {
            operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
          }
          psVar5 = local_590;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600) {
            operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
          }
          if (psVar5 != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            puVar12 = (undefined8 *)
                      ::std::__cxx11::string::_M_append(local_610,(ulong)(psVar5->_M_dataplus)._M_p)
            ;
            pcVar1 = (char *)(puVar12 + 2);
            if ((char *)*puVar12 == pcVar1) {
              auStack_470[0] = puVar12[3];
              local_480._8_6_ = (undefined6)*(undefined8 *)pcVar1;
              local_480._14_2_ = (undefined2)((ulong)*(undefined8 *)pcVar1 >> 0x30);
              local_488 = (undefined1  [8])pcVar21;
            }
            else {
              local_480._8_6_ = (undefined6)*(undefined8 *)pcVar1;
              local_480._14_2_ = (undefined2)((ulong)*(undefined8 *)pcVar1 >> 0x30);
              local_488 = (undefined1  [8])*puVar12;
            }
            local_480._0_6_ = (undefined6)puVar12[1];
            local_480._6_2_ = (undefined2)((ulong)puVar12[1] >> 0x30);
            *puVar12 = pcVar1;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_488);
            if (local_488 != (undefined1  [8])pcVar21) {
              operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600) {
              operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
          ::std::ios_base::~ios_base(aiStack_240);
          iVar10 = 1;
          goto LAB_0023e89b;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._M_p !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5d0) {
        operator_delete(local_5e0._M_p,(ulong)(auStack_5d0._0_8_ + 1));
      }
      if (bVar24) {
        local_550 = p_Var17 + 1;
        iVar10 = ::std::__cxx11::string::compare((char *)local_550);
        if (iVar10 == 0) {
          local_2d0._0_8_ = (long)local_2d0 + 0x10;
          local_5a0 = p_Var17;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"inputs:varname","")
          ;
          p_Var17 = local_5a0;
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_548,(key_type *)local_2d0);
          bVar24 = (_Rb_tree_header *)cVar14._M_node == &local_548._M_impl.super__Rb_tree_header;
          if (local_2d0._0_8_ != (long)local_2d0 + 0x10) {
            operator_delete((void *)local_2d0._0_8_,local_2d0._16_8_ + 1);
          }
        }
        else {
          bVar24 = false;
        }
        if (bVar24) {
          local_5a0 = (_Base_ptr)CONCAT71(local_5a0._1_7_,bVar23);
          local_2b0._0_8_ = ((ulong)local_2b0._0_8_ >> 8 & 0xffffff) << 8;
          local_2b0._8_4_ = local_2b0._8_4_ & 0xffffff00;
          sStack_2a4._0_2_ = 0;
          sStack_2a4._2_2_ = 0;
          local_2a0._0_2_ = 0;
          local_2a0._8_8_ = local_2a0._8_8_ & 0xffffffffffffff00;
          local_220 = (storage_t<double>)0x0;
          local_218 = false;
          local_110._16_8_ = 0;
          local_110._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_110._0_8_ = 0;
          local_110._8_8_ = 0;
          local_e8._0_4_ = _S_red;
          local_e8[8] = false;
          local_e8._9_3_ = 0;
          local_e8._12_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
          local_270[0x10] = false;
          local_270._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_270._8_8_ = (void *)0x0;
          local_290._16_8_ = 0;
          local_290._24_8_ = 0;
          local_290._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_290._8_8_ = 0;
          local_228 = false;
          aiStack_240[8] = (ios_base)0x0;
          aiStack_240[9] = (ios_base)0x0;
          aiStack_240[10] = (ios_base)0x0;
          aiStack_240[0xb] = (ios_base)0x0;
          aiStack_240[0xc] = (ios_base)0x0;
          aiStack_240[0xd] = (ios_base)0x0;
          aiStack_240[0xe] = (ios_base)0x0;
          aiStack_240[0xf] = (ios_base)0x0;
          aiStack_230[0] = (ios_base)0x0;
          aiStack_230[1] = (ios_base)0x0;
          aiStack_230[2] = (ios_base)0x0;
          aiStack_230[3] = (ios_base)0x0;
          aiStack_230[4] = (ios_base)0x0;
          aiStack_230[5] = (ios_base)0x0;
          aiStack_230[6] = (ios_base)0x0;
          aiStack_230[7] = (ios_base)0x0;
          local_258._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          aiStack_240[0] = (ios_base)0x0;
          aiStack_240[1] = (ios_base)0x0;
          aiStack_240[2] = (ios_base)0x0;
          aiStack_240[3] = (ios_base)0x0;
          aiStack_240[4] = (ios_base)0x0;
          aiStack_240[5] = (ios_base)0x0;
          aiStack_240[6] = (ios_base)0x0;
          aiStack_240[7] = (ios_base)0x0;
          local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_258._8_8_ = 0;
          local_1f0[0] = false;
          local_210._16_8_ = 0;
          local_210._24_8_ = 0;
          local_210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
          local_210._8_8_ = 0;
          local_1f0[0x28] = false;
          local_1f0._24_8_ = 0;
          local_1f0._32_8_ = 0;
          local_1f0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1f0._16_8_ = 0;
          local_1a0[0] = false;
          local_1c0._16_8_ = 0;
          local_1c0._24_8_ = 0;
          local_1c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1c0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170[8] = false;
          aStack_180._8_8_ = 0;
          auStack_170._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0._24_8_ = 0;
          aStack_180._M_allocated_capacity = 0;
          local_1a0._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_1a0._16_8_ = 0;
          auStack_148[8] = false;
          auStack_170._32_8_ = 0;
          auStack_148._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_170._24_8_ = 0;
          local_138[0x20] = false;
          local_138._16_8_ = 0;
          local_138._24_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_138._8_8_ = 0;
          local_e8._16_8_ = local_e8;
          auStack_c0[0x18] = false;
          auStack_c0._8_8_ = (pointer)0x0;
          auStack_c0._16_8_ = (pointer)0x0;
          local_c8 = 0;
          auStack_c0._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          auStack_98[8] = false;
          auStack_98._9_8_ = 0;
          auStack_c0._32_8_ = (pointer)0x0;
          auStack_98[0] = 0;
          auStack_98._1_7_ = 0;
          local_80[0x40] = 0;
          local_80._65_8_ = 0;
          local_80._48_8_ = 0;
          local_80[0x38] = 0;
          local_80._57_7_ = 0;
          local_80._32_8_ = 0;
          local_80._40_8_ = 0;
          local_80._16_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._24_8_ = 0;
          local_80._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
          local_80._8_8_ = 0;
          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
          local_e8._24_8_ = local_e8._16_8_;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2f0,*(long *)(p_Var17 + 1),
                     (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
          pcVar21 = local_480 + 8;
          prop_00 = (Property *)local_488;
          local_488 = (undefined1  [8])pcVar21;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","");
          args_2 = (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0;
          anon_unknown_0::ParseTypedAttribute<tinyusdz::Token>
                    ((ParseResult *)local_5e8,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_548,&local_2f0,prop,(string *)prop_00,
                     (TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)local_2b0);
          if (local_488 != (undefined1  [8])pcVar21) {
            operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          bVar23 = (byte)local_5a0;
          if (local_5e8._0_4_ == 3) {
            local_310._0_8_ = local_300;
            ::std::__cxx11::string::_M_construct<char*>
                      (local_310,*(long *)(p_Var17 + 1),
                       (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
            prop_00 = (Property *)local_488;
            local_488 = (undefined1  [8])pcVar21;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)prop_00,"inputs:varname","")
            ;
            args = prop;
            args_2 = local_558;
            (anonymous_namespace)::ParseTypedAttribute<std::__cxx11::string>
                      ((ParseResult *)local_610,(_anonymous_namespace_ *)&local_548,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_310,(string *)prop,prop_00,(string *)local_558,
                       in_stack_fffffffffffff9e8);
            if (local_488 != (undefined1  [8])pcVar21) {
              operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
            }
            psVar5 = local_590;
            if ((long *)local_310._0_8_ != local_300) {
              operator_delete((void *)local_310._0_8_,local_300[0] + 1);
            }
            if (local_610._0_4_ == Success) {
              iVar10 = 3;
              bVar23 = (byte)local_5a0;
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_488,"ReconstructShader",0x11);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
              poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x11b3);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
              local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_588,"Faied to parse inputs:varname: {}","");
              fmt::format<std::__cxx11::string>
                        ((string *)(auStack_5d0 + 0x10),(fmt *)&local_588,(string *)(local_610 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_488,(char *)local_5c0._M_allocated_capacity,
                                   local_5c0._8_8_);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5c0._M_allocated_capacity != &local_5b0) {
                operator_delete((void *)local_5c0._M_allocated_capacity,
                                local_5b0._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_588._M_dataplus._M_p != &local_588.field_2) {
                operator_delete(local_588._M_dataplus._M_p,
                                local_588.field_2._M_allocated_capacity + 1);
              }
              bVar23 = (byte)local_5a0;
              if (psVar5 != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar13 = (long *)::std::__cxx11::string::_M_append
                                            ((char *)&local_588,(ulong)(psVar5->_M_dataplus)._M_p);
                paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar13 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar13 == paVar19) {
                  local_5b0._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_5b0._8_8_ = plVar13[3];
                  local_5c0._M_allocated_capacity = (size_type)&local_5b0;
                }
                else {
                  local_5b0._M_allocated_capacity = paVar19->_M_allocated_capacity;
                  local_5c0._M_allocated_capacity =
                       (size_type)
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)*plVar13;
                }
                local_5c0._8_8_ = plVar13[1];
                *plVar13 = (long)paVar19;
                plVar13[1] = 0;
                *(undefined1 *)(plVar13 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)psVar5,(string *)(auStack_5d0 + 0x10));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c0._M_allocated_capacity != &local_5b0) {
                  operator_delete((void *)local_5c0._M_allocated_capacity,
                                  local_5b0._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_588._M_dataplus._M_p != &local_588.field_2) {
                  operator_delete(local_588._M_dataplus._M_p,
                                  local_588.field_2._M_allocated_capacity + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
              ::std::ios_base::~ios_base(local_418);
              iVar10 = 1;
            }
            if ((undefined1 *)local_610._8_8_ != local_600 + 8) {
              operator_delete((void *)local_610._8_8_,local_600._8_8_ + 1);
            }
          }
          else {
            iVar10 = 0;
            if (local_5e8._0_4_ == 0) {
              bVar24 = ConvertTokenAttributeToStringAttribute
                                 ((TypedAttribute<tinyusdz::Animatable<tinyusdz::Token>_> *)
                                  local_2b0,
                                  (TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_558);
              iVar10 = 3;
              if (!bVar24) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_488);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,"ReconstructShader",0x11);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"():",3);
                poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_488,0x11a1);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_488,
                           "Failed to convert inputs:varname token type to string type.",0x3b);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_488,"\n",1);
                psVar5 = local_590;
                if (local_590 != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  plVar13 = (long *)::std::__cxx11::string::_M_append
                                              (auStack_5d0 + 0x10,(ulong)(psVar5->_M_dataplus)._M_p)
                  ;
                  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (plVar13 + 2);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar13
                      == pbVar18) {
                    local_600._0_8_ = (pbVar18->_M_dataplus)._M_p;
                    local_600._8_8_ = plVar13[3];
                    local_610._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_600;
                  }
                  else {
                    local_600._0_8_ = (pbVar18->_M_dataplus)._M_p;
                    local_610._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *plVar13;
                  }
                  local_610._8_8_ = plVar13[1];
                  *plVar13 = (long)pbVar18;
                  plVar13[1] = 0;
                  *(undefined1 *)(plVar13 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_610);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_610._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600
                     ) {
                    operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_5c0._M_allocated_capacity != &local_5b0) {
                    operator_delete((void *)local_5c0._M_allocated_capacity,
                                    local_5b0._M_allocated_capacity + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_488);
                ::std::ios_base::~ios_base(local_418);
                iVar10 = 1;
              }
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0._M_p !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_5d0) {
            operator_delete(local_5e0._M_p,(ulong)(auStack_5d0._0_8_ + 1));
          }
          if ((bool)auStack_98[0x10] == true) {
            nonstd::optional_lite::detail::storage_t<tinyusdz::Animatable<tinyusdz::Token>_>::
            destruct_value((storage_t<tinyusdz::Animatable<tinyusdz::Token>_> *)local_80);
          }
          ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                    ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(auStack_c0 + 0x20))
          ;
          AttrMetas::~AttrMetas((AttrMetas *)local_2b0);
          if (iVar10 != 0) goto LAB_0023f98c;
        }
        local_4a8 = local_498;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4a8,*(long *)(p_Var17 + 1),
                   (long)&(p_Var17[1]._M_parent)->_M_color + *(long *)(p_Var17 + 1));
        local_588._M_dataplus._M_p = (pointer)&local_588.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_588,"outputs:result","");
        uVar8 = local_4a0;
        sVar6 = local_588._M_string_length;
        local_480._0_6_ = SUB86(auStack_470,0);
        local_480._6_2_ = (undefined2)((ulong)auStack_470 >> 0x30);
        local_480._8_6_ = 0;
        local_480._14_2_ = 0;
        auStack_470[0] = auStack_470[0] & 0xffffffffffffff00;
        __n_00 = local_4a0;
        if (local_588._M_string_length < local_4a0) {
          __n_00 = local_588._M_string_length;
        }
        if (__n_00 == 0) {
          bVar24 = true;
        }
        else {
          iVar10 = bcmp(local_4a8,local_588._M_dataplus._M_p,__n_00);
          bVar24 = iVar10 == 0;
        }
        if ((bool)(bVar24 ^ 1U | uVar8 != sVar6)) {
          local_488._0_4_ = 1;
        }
        else {
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_548,&local_588);
          if ((_Rb_tree_header *)cVar14._M_node == &local_548._M_impl.super__Rb_tree_header) {
            if ((*(uint *)((long)&p_Var17[0x17]._M_parent + 4) < 2) &&
               (bVar24 = Attribute::is_connection((Attribute *)prop), bVar24)) {
              local_488._0_4_ = 5;
              prop_00 = (Property *)0x38;
              ::std::__cxx11::string::_M_replace
                        ((ulong)local_480,0,(char *)CONCAT26(local_480._14_2_,local_480._8_6_),
                         0x3bef31);
            }
            else if (*(int *)((long)&p_Var17[0x17]._M_parent + 4) == 0) {
              Attribute::type_name_abi_cxx11_((string *)local_2b0,(Attribute *)prop);
              bVar24 = tinyusdz::value::IsRoleType((string *)local_2b0);
              local_5e8 = (undefined1  [8])local_5d8;
              local_5d8 = (undefined1  [8])0x66336c616d726f6e;
              local_5e0._M_p = (pointer)0x8;
              auStack_5d0._0_8_ = auStack_5d0._0_8_ & 0xffffffffffffff00;
              lVar3 = CONCAT26(sStack_2a4._2_2_,CONCAT24(sStack_2a4._0_2_,local_2b0._8_4_));
              if ((lVar3 == 8) && (*(long *)local_2b0._0_8_ == 0x66336c616d726f6e)) {
                (local_598->result)._authored = true;
LAB_0023fb9b:
                AttrMetas::operator=(local_560,(AttrMetas *)(p_Var17 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)&local_548,&local_588);
                local_488 = (undefined1  [8])((ulong)local_488 & 0xffffffff00000000);
              }
              else {
                if (bVar24) {
                  local_488._0_4_ = 3;
                  local_5c0._M_allocated_capacity = 0x47;
                  local_610._0_8_ = local_600;
                  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create
                                      ((ulong *)local_610,(ulong)(auStack_5d0 + 0x10));
                  __n_01 = 0x47;
                  pcVar21 = 
                  "Attribute type mismatch. {} expects type `{}` but defined as type `{}`.";
                }
                else {
                  local_5e0._M_p = (pointer)0x6;
                  local_5d8 = (undefined1  [8])0x66003374616f6c66;
                  if ((lVar3 == 6) &&
                     (*(short *)(local_2b0._0_8_ + 4) == 0x3374 &&
                      *(int *)local_2b0._0_8_ == 0x616f6c66)) {
                    (local_598->result)._authored = true;
                    ::std::__cxx11::string::_M_assign(local_4d8);
                    goto LAB_0023fb9b;
                  }
                  local_488._0_4_ = 3;
                  local_5c0._M_allocated_capacity = 0x61;
                  local_610._0_8_ = local_600;
                  pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ::std::__cxx11::string::_M_create
                                      ((ulong *)local_610,(ulong)(auStack_5d0 + 0x10));
                  __n_01 = 0x61;
                  pcVar21 = 
                  "Attribute type mismatch. {} expects type `{}`(and its underlying types) but defined as type `{}`."
                  ;
                }
                uVar4 = local_5c0._M_allocated_capacity;
                local_610._0_8_ = pbVar18;
                local_600._0_8_ = local_5c0._M_allocated_capacity;
                memcpy(pbVar18,pcVar21,__n_01);
                local_610._8_8_ = uVar4;
                *(char *)((long)&(pbVar18->_M_dataplus)._M_p + uVar4) = '\0';
                local_5c0._M_allocated_capacity = (size_type)&local_5b0;
                local_5b0._M_allocated_capacity = 0x66336c616d726f6e;
                local_5c0._8_8_ = 8;
                local_5b0._8_8_ = local_5b0._8_8_ & 0xffffffffffffff00;
                prop_00 = (Property *)local_2b0;
                fmt::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                          ((string *)local_5e8,(fmt *)local_610,&local_588,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (auStack_5d0 + 0x10),
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           prop_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)args_2);
                ::std::__cxx11::string::operator=((string *)local_480,(string *)local_5e8);
                if (local_5e8 != (undefined1  [8])local_5d8) {
                  operator_delete((void *)local_5e8,(ulong)((long)local_5d8 + 1));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_5c0._M_allocated_capacity != &local_5b0) {
                  operator_delete((void *)local_5c0._M_allocated_capacity,
                                  local_5b0._M_allocated_capacity + 1);
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_610._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600)
                {
                  operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
                }
              }
              if ((undefined1 *)local_2b0._0_8_ != local_2a0) {
                operator_delete((void *)local_2b0._0_8_,
                                CONCAT26(local_2a0._6_2_,CONCAT42(local_2a0._2_4_,local_2a0._0_2_))
                                + 1);
              }
            }
            else {
              prop_00 = (Property *)&DAT_00000041;
              ::std::__cxx11::string::_M_replace
                        ((ulong)local_480,0,(char *)CONCAT26(local_480._14_2_,local_480._8_6_),
                         0x3bef6a);
              local_488._0_4_ = 6;
            }
          }
          else {
            local_488._0_4_ = 2;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_588._M_dataplus._M_p != &local_588.field_2) {
          operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
        }
        if (local_4a8 != local_498) {
          operator_delete(local_4a8,local_498[0] + 1);
        }
        iVar10 = 0;
        if (((ulong)local_488 & 0xfffffffd) == 0) {
          iVar10 = 3;
LAB_0023f54d:
          bVar24 = false;
        }
        else {
          bVar24 = true;
          if (local_488._0_4_ != 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x11b9);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            local_610._0_8_ = local_600;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_610,"Parsing shader output property `{}` failed. Error: {}",
                       "");
            fmt::format<char[15],std::__cxx11::string>
                      ((string *)local_5e8,(fmt *)local_610,(string *)"outputs:result",
                       (char (*) [15])local_480,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)prop_00)
            ;
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_5e8,(long)local_5e0._M_p);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            if (local_5e8 != (undefined1  [8])local_5d8) {
              operator_delete((void *)local_5e8,(ulong)((long)local_5d8 + 1));
            }
            psVar5 = local_590;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600) {
              operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
            }
            if (psVar5 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar15 = (long *)::std::__cxx11::string::_M_append
                                          (local_610,(ulong)(psVar5->_M_dataplus)._M_p);
              plVar13 = plVar15 + 2;
              if ((long *)*plVar15 == plVar13) {
                local_5d8 = (undefined1  [8])*plVar13;
                auStack_5d0._0_8_ = plVar15[3];
                local_5e8 = (undefined1  [8])local_5d8;
              }
              else {
                local_5d8 = (undefined1  [8])*plVar13;
                local_5e8 = (undefined1  [8])*plVar15;
              }
              local_5e0._M_p = (pointer)plVar15[1];
              *plVar15 = (long)plVar13;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_5e8);
              if (local_5e8 != (undefined1  [8])local_5d8) {
                operator_delete((void *)local_5e8,(ulong)((long)local_5d8 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_610._0_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600) {
                operator_delete((void *)local_610._0_8_,(ulong)(local_600._0_8_ + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_240);
            iVar10 = 1;
            goto LAB_0023f54d;
          }
        }
        if ((undefined8 *)CONCAT26(local_480._6_2_,local_480._0_6_) != auStack_470) {
          operator_delete((undefined8 *)CONCAT26(local_480._6_2_,local_480._0_6_),auStack_470[0] + 1
                         );
        }
        __k = local_550;
        if (bVar24) {
          local_5a0 = (_Base_ptr)CONCAT71(local_5a0._1_7_,bVar23);
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_548,(key_type *)local_550);
          p_Var2 = &local_548._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)cVar14._M_node == p_Var2) {
            pmVar16 = ::std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      ::operator[](local_4c8,(key_type *)__k);
            ::std::__cxx11::string::_M_assign((string *)pmVar16);
            (pmVar16->_attrib)._varying_authored = (bool)p_Var17[3].field_0x4;
            (pmVar16->_attrib)._variability = p_Var17[3]._M_color;
            ::std::__cxx11::string::_M_assign((string *)&(pmVar16->_attrib)._type_name);
            linb::any::operator=((any *)&(pmVar16->_attrib)._var,(any *)&p_Var17[4]._M_parent);
            (pmVar16->_attrib)._var._blocked = SUB41(p_Var17[5]._M_color,0);
            ::std::
            vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ::operator=((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&(pmVar16->_attrib)._var._ts,
                        (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                         *)&p_Var17[5]._M_parent);
            (pmVar16->_attrib)._var._ts._dirty = SUB41(p_Var17[6]._M_color,0);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar16->_attrib)._paths,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var17[6]._M_parent);
            AttrMetas::operator=(&(pmVar16->_attrib)._metas,(AttrMetas *)(p_Var17 + 7));
            *(_Base_ptr *)&pmVar16->_listOpQual = p_Var17[0x17]._M_parent;
            (pmVar16->_rel).type = *(Type *)&p_Var17[0x17]._M_left;
            Path::operator=(&(pmVar16->_rel).targetPath,(Path *)&p_Var17[0x17]._M_right);
            std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                      (&(pmVar16->_rel).targetPathVector,
                       (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                       &p_Var17[0x1e]._M_parent);
            (pmVar16->_rel).listOpQual = p_Var17[0x1f]._M_color;
            AttrMetas::operator=(&(pmVar16->_rel)._metas,(AttrMetas *)&p_Var17[0x1f]._M_parent);
            (pmVar16->_rel)._varying_authored = *(bool *)&p_Var17[0x2f]._M_left;
            ::std::__cxx11::string::_M_assign((string *)&pmVar16->_prop_value_type_name);
            __k = local_550;
            pmVar16->_has_custom = *(bool *)&p_Var17[0x30]._M_right;
            ::std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_548,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_550);
          }
          cVar14 = ::std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_548,(key_type *)__k);
          iVar10 = 0;
          if ((_Rb_tree_header *)cVar14._M_node == p_Var2) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"[warn]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2b0,"ReconstructShader",0x11);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"():",3);
            poVar11 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2b0,0x11bb);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_488,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
            poVar11 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2b0,(char *)local_488,
                                 CONCAT26(local_480._6_2_,local_480._0_6_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
            bVar23 = (byte)local_5a0;
            if (local_488 != (undefined1  [8])(local_480 + 8)) {
              operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
            }
            psVar5 = local_4c0;
            if (local_4c0 != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              puVar12 = (undefined8 *)
                        ::std::__cxx11::string::_M_append
                                  (local_5e8,(ulong)(local_590->_M_dataplus)._M_p);
              pcVar21 = (char *)(puVar12 + 2);
              if ((char *)*puVar12 == pcVar21) {
                auStack_470[0] = puVar12[3];
                local_480._8_6_ = (undefined6)*(undefined8 *)pcVar21;
                local_480._14_2_ = (undefined2)((ulong)*(undefined8 *)pcVar21 >> 0x30);
                local_488 = (undefined1  [8])(local_480 + 8);
              }
              else {
                local_480._8_6_ = (undefined6)*(undefined8 *)pcVar21;
                local_480._14_2_ = (undefined2)((ulong)*(undefined8 *)pcVar21 >> 0x30);
                local_488 = (undefined1  [8])*puVar12;
              }
              local_480._0_6_ = (undefined6)puVar12[1];
              local_480._6_2_ = (undefined2)((ulong)puVar12[1] >> 0x30);
              *puVar12 = pcVar21;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)psVar5,(string *)local_488);
              if (local_488 != (undefined1  [8])(local_480 + 8)) {
                operator_delete((void *)local_488,CONCAT26(local_480._14_2_,local_480._8_6_) + 1);
              }
              if (local_5e8 != (undefined1  [8])local_5d8) {
                operator_delete((void *)local_5e8,(ulong)((long)local_5d8 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
            ::std::ios_base::~ios_base(aiStack_240);
          }
          else {
            bVar23 = (byte)local_5a0;
          }
        }
      }
LAB_0023f98c:
      if ((iVar10 != 3) && (iVar10 != 0)) break;
      p_Var17 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var17);
      bVar23 = p_Var17 == local_4b0;
    } while (!(bool)bVar23);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&local_548,(_Link_type)local_548._M_impl.super__Rb_tree_header._M_header._M_parent);
  return (bool)(bVar23 & 1);
}

Assistant:

bool ReconstructShader<UsdPrimvarReader_normal>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    UsdPrimvarReader_normal *preader,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options)
{
  (void)spec;
  (void)references;
  (void)options;
  std::set<std::string> table;
  table.insert("info:id"); // `info:id` is already parsed in ReconstructPrim<Shader>

  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "inputs:fallback", UsdPrimvarReader_normal,
                   preader->fallback)
    if ((prop.first == kInputsVarname) && !table.count(kInputsVarname)) {
      // Support older spec: `token` for varname
      TypedAttribute<Animatable<value::token>> tok_attr;
      auto ret = ParseTypedAttribute(table, prop.first, prop.second, kInputsVarname, tok_attr);
      if (ret.code == ParseResult::ResultCode::Success) {
        if (!ConvertTokenAttributeToStringAttribute(tok_attr, preader->varname)) {
          PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname token type to string type.");
        }
        DCOUT("`token` attribute is converted to `string` attribute.");
        continue;
      } else if (ret.code == ParseResult::ResultCode::TypeMismatch) {
        //TypedAttribute<Animatable<value::StringData>> sdata_attr;
        //auto sdret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", sdata_attr);
        //if (sdret.code == ParseResult::ResultCode::Success) {
        //  if (!ConvertStringDataAttributeToStringAttribute(sdata_attr, preader->varname)) {
        //    PUSH_ERROR_AND_RETURN("Failed to convert inputs:varname StringData type to string type.");
        //  }
        //} else if (sdret.code == ParseResult::ResultCode::TypeMismatch) {
          auto sret = ParseTypedAttribute(table, prop.first, prop.second, "inputs:varname", preader->varname);
          if (sret.code == ParseResult::ResultCode::Success) {
            DCOUT("Parsed string typed inputs:varname.");
            // ok
            continue;
          } else {
            PUSH_ERROR_AND_RETURN(fmt::format("Faied to parse inputs:varname: {}", sret.err));
          }
        //}
      }
    }
    PARSE_SHADER_TERMINAL_ATTRIBUTE(table, prop, "outputs:result",
                                  UsdPrimvarReader_normal, preader->result)
    ADD_PROPERTY(table, prop, UsdPrimvarReader_normal, preader->props)
    PARSE_PROPERTY_END_MAKE_WARN(table, prop)
  }
  return true;
}